

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
clean(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
      *this,Lit *idx)

{
  Watcher *pWVar1;
  vec<Glucose::Solver::Watcher> *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  pvVar2 = (this->occs).data;
  iVar3 = pvVar2[idx->x].sz;
  if (0 < iVar3) {
    pvVar2 = pvVar2 + idx->x;
    lVar5 = 0;
    iVar6 = 0;
    do {
      pWVar1 = pvVar2->data;
      if (((((this->deleted).ca)->super_RegionAllocator<unsigned_int>).memory[pWVar1[lVar5].cref] &
          3) != 1) {
        lVar4 = (long)iVar6;
        iVar6 = iVar6 + 1;
        pWVar1[lVar4] = pWVar1[lVar5];
        iVar3 = pvVar2->sz;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
    if (0 < (int)lVar5 - iVar6) {
      pvVar2->sz = (iVar3 + iVar6) - (int)lVar5;
    }
  }
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}